

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *src;
  Mat *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  int *piVar14;
  Mat *pMVar15;
  uint uVar16;
  void *pvVar17;
  int iVar18;
  size_t sVar19;
  uint *puVar20;
  Allocator *pAVar21;
  int ref_w;
  Mat *in_R8;
  int ref_h;
  int iVar22;
  int *piVar23;
  ulong uVar24;
  long lVar25;
  undefined8 in_R11;
  int *piVar26;
  uint *puVar27;
  void *pvVar28;
  int h;
  long lVar29;
  long lVar30;
  int iVar31;
  int *piVar32;
  int _woffset;
  uint local_198;
  int _outw;
  int _hoffset;
  int _outh;
  int _coffset;
  undefined4 local_184;
  ulong local_180;
  int _outc;
  int _outd;
  int _doffset;
  ulong local_168;
  Mat *local_160;
  ulong local_158;
  Mat m_1;
  ulong local_108;
  Mat m;
  Mat m_2;
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  iVar6 = src->w;
  uVar16 = src->h;
  iVar13 = src->d;
  iVar22 = src->c;
  local_158 = CONCAT44(local_158._4_4_,iVar22);
  uVar1 = src->dims;
  local_180 = (ulong)uVar1;
  local_160 = (Mat *)src->elemsize;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _coffset = -1;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  if (((this->starts_expr)._M_string_length == 0) || ((this->ends_expr)._M_string_length == 0)) {
    uVar5 = this->woffset;
    if (uVar5 != 0xffffff17) {
      iVar11 = 0;
      iVar18 = 0;
      switch(uVar1) {
      case 1:
        iVar11 = 1;
        iVar18 = 1;
        break;
      case 2:
        iVar18 = 2;
        iVar11 = 1;
        break;
      case 3:
        iVar11 = src->elempack * iVar22;
        iVar18 = 3;
        break;
      case 4:
        iVar11 = src->elempack * iVar22;
        iVar18 = 4;
      }
      switch(src[1].dims) {
      case 1:
        in_R8 = (Mat *)(ulong)(uint)(src[1].elempack * src[1].w);
        uVar24 = 0;
        iVar22 = 1;
        break;
      case 2:
        in_R8 = (Mat *)(ulong)(uint)src[1].w;
        iVar22 = src[1].elempack * src[1].h;
        uVar24 = 0;
        break;
      case 3:
        in_R8 = (Mat *)(ulong)(uint)src[1].w;
        iVar22 = src[1].h;
        uVar24 = 0;
        break;
      case 4:
        in_R8 = (Mat *)(ulong)(uint)src[1].w;
        iVar22 = src[1].h;
        uVar24 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
        break;
      default:
        iVar22 = 0;
        in_R8 = (Mat *)0x0;
        uVar24 = 0;
      }
      if (iVar18 - 1U < 4) {
        iVar6 = (*(code *)(&DAT_005a88e0 + *(int *)(&DAT_005a88e0 + (ulong)(iVar18 - 1U) * 4)))
                          (this,&DAT_005a88e0 + *(int *)(&DAT_005a88e0 + (ulong)(iVar18 - 1U) * 4),
                           uVar24 & 0xffffffff,iVar11,in_R8,iVar22);
        return iVar6;
      }
      goto LAB_0026e03f;
    }
    switch(uVar1) {
    case 1:
      piVar7 = (int *)src[1].data;
      puVar27 = (uint *)&_outw;
      lVar8 = 0xc;
      piVar12 = &_woffset;
      piVar14 = piVar7;
      goto LAB_0026deb2;
    case 2:
      piVar7 = (int *)src[1].data;
      puVar27 = (uint *)&_outh;
      lVar8 = 0x10;
      piVar12 = &_outw;
      lVar9 = 0xc;
      puVar20 = (uint *)&_hoffset;
      lVar30 = 4;
      piVar23 = &_woffset;
      piVar14 = piVar7;
      goto LAB_0026dea2;
    case 3:
      piVar7 = (int *)src[1].data;
      lVar8 = 0x14;
      piVar12 = &_outh;
      lVar9 = 0x10;
      puVar20 = (uint *)&_outw;
      lVar30 = 0xc;
      piVar23 = &_coffset;
      lVar25 = 8;
      piVar14 = &_hoffset;
      lVar29 = 4;
      piVar32 = &_woffset;
      piVar26 = piVar7;
      break;
    case 4:
      piVar7 = (int *)src[1].data;
      _woffset = *piVar7;
      _hoffset = piVar7[1];
      lVar8 = 0x1c;
      piVar12 = &_outd;
      lVar9 = 0x18;
      puVar20 = (uint *)&_outh;
      lVar30 = 0x14;
      piVar23 = &_outw;
      lVar25 = 0x10;
      piVar14 = &_coffset;
      lVar29 = 0xc;
      piVar32 = &_doffset;
      piVar26 = piVar7 + 2;
      break;
    default:
      goto LAB_0026ed2d;
    }
    local_168 = CONCAT44(local_168._4_4_,iVar6);
    local_198 = uVar16;
    *piVar32 = *piVar26;
    *piVar14 = *(int *)((long)piVar7 + lVar29);
    puVar27 = (uint *)&_outc;
    piVar14 = (int *)(lVar25 + (long)piVar7);
    uVar16 = local_198;
LAB_0026dea2:
    *piVar23 = *piVar14;
    in_R8 = (Mat *)(ulong)*(uint *)((long)piVar7 + lVar30);
    *puVar20 = *(uint *)((long)piVar7 + lVar30);
    piVar14 = (int *)(lVar9 + (long)piVar7);
LAB_0026deb2:
    *piVar12 = *piVar14;
    uVar5 = *(uint *)((long)piVar7 + lVar8);
    *puVar27 = uVar5;
  }
  else {
    in_R8 = (Mat *)&_doffset;
    uVar5 = eval_crop_expr(this,bottom_blobs,&_woffset,&_hoffset,(int *)in_R8,&_coffset,&_outw,
                           &_outh,&_outd,&_outc);
  }
LAB_0026e03f:
  pMVar15 = local_160;
  iVar11 = _outc;
  iVar22 = (int)local_180;
  if (iVar22 == 3) {
    local_198 = uVar16;
    if (_outc == (int)local_158 && (_outh == uVar16 && _outw == iVar6)) {
      if (this_00 == src) {
        return 0;
      }
      piVar14 = src->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = this_00->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar28 = this_00->data;
          pAVar21 = this_00->allocator;
          if (pAVar21 != (Allocator *)0x0) goto LAB_0026e8c7;
          if (pvVar28 == (void *)0x0) goto LAB_0026ecc7;
LAB_0026ecbf:
          free(pvVar28);
        }
      }
    }
    else {
      m.w = src->w;
      in_R8 = (Mat *)(long)m.w;
      m.h = src->h;
      m.d = src->d;
      m.elemsize = src->elemsize;
      m.data = (void *)((long)_coffset * src->cstep * m.elemsize + (long)src->data);
      m.elempack = src->elempack;
      m.allocator = src->allocator;
      m.refcount = (int *)0x0;
      m.c = _outc;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)in_R8 + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = src->dims;
      if (_outh != uVar16 || _outw != iVar6) {
        in_R8 = local_160;
        Mat::create(this_00,_outw,_outh,_outc,(size_t)local_160,opt->blob_allocator);
        iVar18 = _hoffset;
        iVar22 = _woffset;
        uVar5 = 0xffffff9c;
        uVar16 = local_198;
        if ((this_00->data == (void *)0x0) ||
           (lVar8 = (long)this_00->c * this_00->cstep, lVar8 == 0)) {
          local_184 = 0;
        }
        else {
          local_184 = (undefined4)CONCAT71((int7)((ulong)lVar8 >> 8),1);
          if (0 < iVar11) {
            lVar8 = (long)_woffset;
            lVar9 = (long)_hoffset;
            uVar24 = 0;
            local_168 = CONCAT44(local_168._4_4_,iVar6);
            do {
              lVar30 = (long)m.w;
              m_1.data = (void *)(m.cstep * uVar24 * m.elemsize + (long)m.data);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = m.elemsize;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.w = m.w;
              m_1.h = m.h;
              m_1.c = m.d;
              m_1.d = 1;
              m_1.dims = m.dims + -1;
              m_1.cstep = (m.elemsize * m.h * lVar30 + 0xf & 0xfffffffffffffff0) / m.elemsize;
              if (m.dims == 4) {
                m_1.cstep = m.h * lVar30;
              }
              uVar5 = this_00->w;
              iVar6 = this_00->h;
              m_2.elemsize = this_00->elemsize;
              pvVar28 = (void *)(this_00->cstep * uVar24 * m_2.elemsize + (long)this_00->data);
              m_2.elempack = this_00->elempack;
              m_2.allocator = this_00->allocator;
              m_2.refcount = (int *)0x0;
              m_2.c = this_00->d;
              m_2.d = 1;
              sVar19 = (long)iVar6 * (long)(int)uVar5;
              m_2.dims = this_00->dims + -1;
              m_2.cstep = (m_2.elemsize * sVar19 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
              if (this_00->dims == 4) {
                m_2.cstep = sVar19;
              }
              in_R8 = this_00;
              m_2.data = pvVar28;
              m_2.w = uVar5;
              m_2.h = iVar6;
              if (local_160 == (Mat *)&DAT_00000004) {
                copy_cut_border_image<float>(&m_1,&m_2,iVar18,iVar22);
              }
              else if (local_160 == (Mat *)0x2) {
                copy_cut_border_image<unsigned_short>(&m_1,&m_2,iVar18,iVar22);
              }
              else if ((local_160 == (Mat *)0x1) && (0 < iVar6)) {
                pvVar17 = (void *)((long)m_1.data + m.elemsize * lVar30 * lVar9 + lVar8);
                iVar31 = 0;
                do {
                  if ((int)uVar5 < 0xc) {
                    if (0 < (int)uVar5) {
                      uVar10 = 0;
                      do {
                        *(undefined1 *)((long)pvVar28 + uVar10) =
                             *(undefined1 *)((long)pvVar17 + uVar10);
                        uVar10 = uVar10 + 1;
                      } while (uVar5 != uVar10);
                    }
                  }
                  else {
                    memcpy(pvVar28,pvVar17,(ulong)uVar5);
                  }
                  pvVar28 = (void *)((long)pvVar28 + (long)(int)uVar5);
                  pvVar17 = (void *)((long)pvVar17 + lVar30);
                  iVar31 = iVar31 + 1;
                } while (iVar31 != iVar6);
              }
              uVar24 = uVar24 + 1;
              iVar6 = (int)local_168;
              uVar16 = local_198;
            } while (uVar24 < (uint)iVar11);
          }
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,opt->blob_allocator,_outh,in_R8);
        uVar16 = local_198;
        if (this_00 != &m_1) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar14 = this_00->refcount;
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (*piVar14 == 0) {
              if (this_00->allocator == (Allocator *)0x0) {
                if (this_00->data != (void *)0x0) {
                  free(this_00->data);
                }
              }
              else {
                (*this_00->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_00->data = m_1.data;
          this_00->refcount = m_1.refcount;
          this_00->elemsize = m_1.elemsize;
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (this_00->data != (void *)0x0) {
          uVar5 = 0;
          local_184 = 0;
          if ((long)this_00->c * this_00->cstep != 0) goto LAB_0026e7f3;
        }
        uVar5 = 0xffffff9c;
        local_184 = 0;
      }
LAB_0026e7f3:
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar22 = (int)local_180;
      if ((char)local_184 == '\0') {
        return uVar5;
      }
LAB_0026e846:
      pMVar15 = local_160;
      iVar11 = _outd;
      if (iVar22 != 4) {
        return 0;
      }
      bVar2 = iVar13 == _outd;
      bVar3 = uVar16 == _outh;
      bVar4 = iVar6 == _outw;
      local_198 = uVar5;
      if (_outc != (int)local_158 || (!bVar2 || (!bVar3 || !bVar4))) {
        m.w = src->w;
        m.h = src->h;
        m.d = src->d;
        m.elemsize = src->elemsize;
        m.data = (void *)((long)_coffset * src->cstep * m.elemsize + (long)src->data);
        m.elempack = src->elempack;
        m.allocator = src->allocator;
        m.refcount = (int *)0x0;
        m.c = _outc;
        m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                  m.elemsize;
        m.dims = src->dims;
        if (bVar2 && (bVar3 && bVar4)) {
          Mat::clone(&m_1,(__fn *)&m,opt->blob_allocator,_outh,
                     (void *)CONCAT71((int7)((ulong)in_R8 >> 8),bVar2 && (bVar3 && bVar4)));
          if (this_00 != &m_1) {
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + 1;
              UNLOCK();
            }
            piVar14 = this_00->refcount;
            if (piVar14 != (int *)0x0) {
              LOCK();
              *piVar14 = *piVar14 + -1;
              UNLOCK();
              if (*piVar14 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  if (this_00->data != (void *)0x0) {
                    free(this_00->data);
                  }
                }
                else {
                  (*this_00->allocator->_vptr_Allocator[3])();
                }
              }
            }
            this_00->data = m_1.data;
            this_00->refcount = m_1.refcount;
            this_00->elemsize = m_1.elemsize;
            this_00->elempack = m_1.elempack;
            this_00->allocator = m_1.allocator;
            this_00->dims = m_1.dims;
            this_00->w = m_1.w;
            this_00->h = m_1.h;
            this_00->d = m_1.d;
            this_00->c = m_1.c;
            this_00->cstep = m_1.cstep;
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (this_00->data != (void *)0x0) {
            local_198 = 0;
            bVar2 = false;
            if ((long)this_00->c * this_00->cstep != 0) goto LAB_0026edf8;
          }
          local_198 = 0xffffff9c;
          bVar2 = false;
        }
        else {
          uVar24 = (ulong)(uint)_outd;
          Mat::create(this_00,_outw,_outh,_outd,_outc,(size_t)local_160,opt->blob_allocator);
          if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
            bVar2 = false;
            local_198 = 0xffffff9c;
          }
          else {
            bVar2 = true;
            if (0 < _outc) {
              local_168 = (ulong)(uint)_outc;
              local_108 = 0;
              do {
                if (0 < iVar11) {
                  uVar10 = 0;
                  do {
                    local_180 = (ulong)m.w;
                    m_1.cstep = (long)m.h * local_180;
                    m_1.data = (void *)((long)m.data +
                                       ((long)(int)uVar10 + (long)_doffset) * m.elemsize * m_1.cstep
                                       + m.cstep * local_108 * m.elemsize);
                    m_1.refcount = (int *)0x0;
                    m_1.elemsize = m.elemsize;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.dims = 2;
                    m_1.w = m.w;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    uVar16 = this_00->w;
                    m_2.elemsize = this_00->elemsize;
                    iVar6 = this_00->h;
                    m_2.elempack = this_00->elempack;
                    m_2.cstep = (long)iVar6 * (long)(int)uVar16;
                    pvVar28 = (void *)((long)this_00->data +
                                      uVar10 * m_2.elemsize * m_2.cstep +
                                      this_00->cstep * local_108 * m_2.elemsize);
                    m_2.allocator = this_00->allocator;
                    m_2.refcount = (int *)0x0;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    local_158 = uVar10;
                    m_2.data = pvVar28;
                    m_2.w = uVar16;
                    m_2.h = iVar6;
                    if (pMVar15 == (Mat *)&DAT_00000004) {
                      copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                    }
                    else if (pMVar15 == (Mat *)0x2) {
                      copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                    }
                    else if ((pMVar15 == (Mat *)0x1) && (0 < iVar6)) {
                      pvVar17 = (void *)((long)m_1.data +
                                        (long)_hoffset * local_180 * m.elemsize + (long)_woffset);
                      iVar13 = 0;
                      do {
                        if ((int)uVar16 < 0xc) {
                          if (0 < (int)uVar16) {
                            uVar10 = 0;
                            do {
                              *(undefined1 *)((long)pvVar28 + uVar10) =
                                   *(undefined1 *)((long)pvVar17 + uVar10);
                              uVar10 = uVar10 + 1;
                            } while (uVar16 != uVar10);
                          }
                        }
                        else {
                          memcpy(pvVar28,pvVar17,(ulong)uVar16);
                        }
                        pvVar28 = (void *)((long)pvVar28 + (long)(int)uVar16);
                        pvVar17 = (void *)((long)pvVar17 + local_180);
                        iVar13 = iVar13 + 1;
                      } while (iVar13 != iVar6);
                    }
                    uVar10 = local_158 + 1;
                    pMVar15 = local_160;
                  } while (uVar10 < uVar24);
                }
                local_108 = local_108 + 1;
              } while (local_108 < local_168);
              bVar2 = true;
            }
          }
        }
LAB_0026edf8:
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (bVar2) {
          return 0;
        }
        return local_198;
      }
      if (this_00 == src) {
        return 0;
      }
      piVar14 = src->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = this_00->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar28 = this_00->data;
          pAVar21 = this_00->allocator;
          if (pAVar21 == (Allocator *)0x0) goto joined_r0x0026e11f;
LAB_0026e8c7:
          (*pAVar21->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    if (iVar22 != 2) {
      if (iVar22 == 1) {
        if (_outw != iVar6) {
          Mat::create(this_00,_outw,(size_t)local_160,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return 0xffffff9c;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return 0xffffff9c;
          }
          if (pMVar15 == (Mat *)&DAT_00000004) {
            iVar6 = 0;
            goto LAB_0026e71d;
          }
          if (pMVar15 == (Mat *)0x2) {
            iVar6 = 0;
            goto LAB_0026e707;
          }
          if (pMVar15 != (Mat *)0x1) {
            return 0;
          }
          iVar6 = 0;
          goto LAB_0026e390;
        }
        if (this_00 == src) {
          return 0;
        }
        piVar14 = src->refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        piVar14 = this_00->refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            pvVar28 = this_00->data;
            pAVar21 = this_00->allocator;
            goto joined_r0x0026e116;
          }
        }
        goto LAB_0026ecc7;
      }
      goto LAB_0026e846;
    }
    if (uVar16 != _outh || iVar6 != _outw) {
      Mat::create(this_00,_outw,_outh,(size_t)local_160,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return 0xffffff9c;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return 0xffffff9c;
      }
      iVar6 = _hoffset;
      if (pMVar15 == (Mat *)&DAT_00000004) {
LAB_0026e71d:
        copy_cut_border_image<float>(src,this_00,iVar6,_woffset);
        return 0;
      }
      if (pMVar15 == (Mat *)0x2) {
LAB_0026e707:
        copy_cut_border_image<unsigned_short>(src,this_00,iVar6,_woffset);
        return 0;
      }
      if (pMVar15 != (Mat *)0x1) {
        return 0;
      }
LAB_0026e390:
      copy_cut_border_image<signed_char>(src,this_00,iVar6,_woffset);
      return 0;
    }
    if (this_00 == src) {
      return 0;
    }
    piVar14 = src->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    piVar14 = this_00->refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        pvVar28 = this_00->data;
        pAVar21 = this_00->allocator;
joined_r0x0026e116:
        uVar5 = local_198;
        if (pAVar21 != (Allocator *)0x0) goto LAB_0026e8c7;
joined_r0x0026e11f:
        local_198 = uVar5;
        if (pvVar28 != (void *)0x0) goto LAB_0026ecbf;
      }
    }
  }
LAB_0026ecc7:
  this_00->cstep = 0;
  this_00->data = (void *)0x0;
  this_00->refcount = (int *)0x0;
  *(undefined8 *)((long)&this_00->refcount + 4) = 0;
  *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
  this_00->dims = 0;
  this_00->w = 0;
  this_00->h = 0;
  this_00->d = 0;
  this_00->c = 0;
  piVar14 = src->refcount;
  this_00->data = src->data;
  this_00->refcount = piVar14;
  this_00->elemsize = src->elemsize;
  this_00->elempack = src->elempack;
  this_00->allocator = src->allocator;
  iVar6 = src->w;
  iVar13 = src->h;
  iVar22 = src->d;
  this_00->dims = src->dims;
  this_00->w = iVar6;
  this_00->h = iVar13;
  this_00->d = iVar22;
  this_00->c = src->c;
  this_00->cstep = src->cstep;
LAB_0026ed2d:
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}